

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O3

bool __thiscall BmsParser::Parser::Load(Parser *this,char *path)

{
  bool bVar1;
  FILE *__stream;
  char *text;
  size_t sVar2;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    bVar1 = false;
  }
  else {
    text = (char *)operator_new__(0xa00000);
    sVar2 = fread(text,1,0xa00000,__stream);
    text[(int)sVar2] = '\0';
    bVar1 = Parse(this,text);
    operator_delete__(text);
    fclose(__stream);
  }
  return bVar1;
}

Assistant:

bool Parser::Load(const char* path) {
#ifdef _WIN32
		/* convert utf8 path to utf16 for windows */
		wchar_t pathw[1024];
		BmsUtil::utf8_to_wchar(path, pathw, 1024);
		return Load(pathw);
#else
		FILE *fp;
		if (fopen_s(&fp, path, "rb") == 0) {
			// read whole file (about limit to 10mb)
			char *buf = new char[1024 * 1024 * 10];
			int l = fread(buf, 1, 1024 * 1024 * 10, fp);
			buf[l] = 0;
			// parse
			bool r = Parse(buf);
			// cleanup
			delete[] buf;
			fclose(fp);
			return r;
		}
		else {
			// IO error, but don't make log - log clering is a tidious thing...
			return false;
		}
#endif
	}